

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::TrimCapabilitiesPass::addInstructionRequirements
          (TrimCapabilitiesPass *this,Instruction *instruction,CapabilitySet *capabilities,
          ExtensionSet *extensions)

{
  ExtensionSet *this_00;
  bool bVar1;
  Op OVar2;
  Operand *operand;
  type *ptVar3;
  pointer pvVar4;
  Capability *value;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_90;
  _Optional_payload_base<spv::Capability> local_70;
  optional<spv::Capability> result;
  OpcodeHandler handler;
  type it;
  type *end;
  type *begin;
  pair<std::__detail::_Node_const_iterator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_false,_true>_>
  local_40;
  uint local_30;
  uint local_2c;
  uint32_t i;
  uint32_t operandCount;
  ExtensionSet *extensions_local;
  CapabilitySet *capabilities_local;
  Instruction *instruction_local;
  TrimCapabilitiesPass *this_local;
  
  _i = extensions;
  extensions_local = (ExtensionSet *)capabilities;
  capabilities_local = (CapabilitySet *)instruction;
  instruction_local = (Instruction *)this;
  OVar2 = opt::Instruction::opcode(instruction);
  if ((OVar2 != OpCapability) &&
     (OVar2 = opt::Instruction::opcode((Instruction *)capabilities_local), OVar2 != OpExtension)) {
    OVar2 = opt::Instruction::opcode((Instruction *)capabilities_local);
    if (OVar2 == OpExtInst) {
      addInstructionRequirementsForExtInst
                (this,(Instruction *)capabilities_local,(CapabilitySet *)extensions_local);
    }
    else {
      OVar2 = opt::Instruction::opcode((Instruction *)capabilities_local);
      addInstructionRequirementsForOpcode(this,OVar2,(CapabilitySet *)extensions_local,_i);
    }
    local_2c = opt::Instruction::NumOperands((Instruction *)capabilities_local);
    for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
      operand = opt::Instruction::GetOperand((Instruction *)capabilities_local,local_30);
      addInstructionRequirementsForOperand(this,operand,(CapabilitySet *)extensions_local,_i);
    }
    begin._4_4_ = opt::Instruction::opcode((Instruction *)capabilities_local);
    local_40 = std::
               unordered_multimap<spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*),_spvtools::opt::ClassEnumHash,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>_>_>
               ::equal_range(&this->opcodeHandlers_,(key_type *)((long)&begin + 4));
    ptVar3 = std::
             get<0ul,std::__detail::_Node_const_iterator<std::pair<spv::Op_const,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*)>,false,true>,std::__detail::_Node_const_iterator<std::pair<spv::Op_const,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*)>,false,true>>
                       (&local_40);
    it.
    super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
               )std::
                get<1ul,std::__detail::_Node_const_iterator<std::pair<spv::Op_const,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*)>,false,true>,std::__detail::_Node_const_iterator<std::pair<spv::Op_const,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*)>,false,true>>
                          (&local_40);
    handler = (OpcodeHandler)
              (ptVar3->
              super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
              )._M_cur;
    while (bVar1 = std::__detail::operator!=
                             ((_Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
                               *)&handler,
                              (_Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
                               *)it.
                                 super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
                                 ._M_cur), bVar1) {
      pvVar4 = std::__detail::
               _Node_const_iterator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_false,_true>
                             *)&handler);
      result.super__Optional_base<spv::Capability,_true,_true>._M_payload.
      super__Optional_payload_base<spv::Capability> =
           (_Optional_base<spv::Capability,_true,_true>)pvVar4->second;
      local_70 = (_Optional_payload_base<spv::Capability>)
                 (*(code *)result.super__Optional_base<spv::Capability,_true,_true>._M_payload.
                           super__Optional_payload_base<spv::Capability>)(capabilities_local);
      bVar1 = std::optional<spv::Capability>::has_value((optional<spv::Capability> *)&local_70);
      this_00 = extensions_local;
      if (bVar1) {
        value = std::optional<spv::Capability>::operator*((optional<spv::Capability> *)&local_70);
        EnumSet<spv::Capability>::insert(&local_90,(EnumSet<spv::Capability> *)this_00,value);
      }
      std::__detail::
      _Node_const_iterator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_false,_true>
                    *)&handler,0);
    }
  }
  return;
}

Assistant:

void TrimCapabilitiesPass::addInstructionRequirements(
    Instruction* instruction, CapabilitySet* capabilities,
    ExtensionSet* extensions) const {
  // Ignoring OpCapability and OpExtension instructions.
  if (instruction->opcode() == spv::Op::OpCapability ||
      instruction->opcode() == spv::Op::OpExtension) {
    return;
  }

  if (instruction->opcode() == spv::Op::OpExtInst) {
    addInstructionRequirementsForExtInst(instruction, capabilities);
  } else {
    addInstructionRequirementsForOpcode(instruction->opcode(), capabilities,
                                        extensions);
  }

  // Second case: one of the opcode operand is gated by a capability.
  const uint32_t operandCount = instruction->NumOperands();
  for (uint32_t i = 0; i < operandCount; i++) {
    addInstructionRequirementsForOperand(instruction->GetOperand(i),
                                         capabilities, extensions);
  }

  // Last case: some complex logic needs to be run to determine capabilities.
  auto[begin, end] = opcodeHandlers_.equal_range(instruction->opcode());
  for (auto it = begin; it != end; it++) {
    const OpcodeHandler handler = it->second;
    auto result = handler(instruction);
    if (!result.has_value()) {
      continue;
    }

    capabilities->insert(*result);
  }
}